

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

SC_Lib * Abc_SclReadFromFile(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  Vec_Str_t *p_00;
  char *pcVar3;
  size_t sVar4;
  int nFileSize;
  Vec_Str_t *vOut;
  FILE *pFile;
  SC_Lib *p;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    rewind(__stream);
    p_00 = Vec_StrAlloc((int)lVar2);
    p_00->nSize = p_00->nCap;
    iVar1 = Vec_StrSize(p_00);
    if ((int)lVar2 != iVar1) {
      __assert_fail("nFileSize == Vec_StrSize(vOut)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                    ,0x1b4,"SC_Lib *Abc_SclReadFromFile(char *)");
    }
    pcVar3 = Vec_StrArray(p_00);
    iVar1 = Vec_StrSize(p_00);
    sVar4 = fread(pcVar3,1,(long)iVar1,__stream);
    iVar1 = Vec_StrSize(p_00);
    if ((int)sVar4 != iVar1) {
      __assert_fail("nFileSize == Vec_StrSize(vOut)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                    ,0x1b6,"SC_Lib *Abc_SclReadFromFile(char *)");
    }
    fclose(__stream);
    pFileName_local = (char *)Abc_SclReadFromStr(p_00);
    if ((SC_Lib *)pFileName_local != (SC_Lib *)0x0) {
      pcVar3 = Abc_UtilStrsav(pFileName);
      ((SC_Lib *)pFileName_local)->pFileName = pcVar3;
      Abc_SclLibNormalize((SC_Lib *)pFileName_local);
    }
    Vec_StrFree(p_00);
  }
  return (SC_Lib *)pFileName_local;
}

Assistant:

SC_Lib * Abc_SclReadFromFile( char * pFileName )
{
    SC_Lib * p;
    FILE * pFile;
    Vec_Str_t * vOut;
    int nFileSize;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile );  
    rewind( pFile ); 
    // load the contents
    vOut = Vec_StrAlloc( nFileSize );
    vOut->nSize = vOut->nCap;
    assert( nFileSize == Vec_StrSize(vOut) );
    nFileSize = fread( Vec_StrArray(vOut), 1, Vec_StrSize(vOut), pFile );
    assert( nFileSize == Vec_StrSize(vOut) );
    fclose( pFile );
    // read the library
    p = Abc_SclReadFromStr( vOut );
    if ( p != NULL )
        p->pFileName = Abc_UtilStrsav( pFileName );
    if ( p != NULL )
        Abc_SclLibNormalize( p );
    Vec_StrFree( vOut );
    return p;
}